

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall HighsHashTable<MatrixRow,_int>::HighsHashTable(HighsHashTable<MatrixRow,_int> *this)

{
  unique_ptr<HighsHashTableEntry<MatrixRow,_int>,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
  *in_RDI;
  HighsHashTable<MatrixRow,_int> *unaff_retaddr;
  unique_ptr<HighsHashTableEntry<MatrixRow,_int>,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
  *capacity;
  
  capacity = in_RDI;
  std::unique_ptr<HighsHashTableEntry<MatrixRow,int>,HighsHashTable<MatrixRow,int>::OpNewDeleter>::
  unique_ptr<HighsHashTable<MatrixRow,int>::OpNewDeleter,void>(in_RDI);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  in_RDI[4]._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<MatrixRow,_int>,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<MatrixRow,_int>_*,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<MatrixRow,_int>_*,_false>._M_head_impl =
       (HighsHashTableEntry<MatrixRow,_int> *)0x0;
  makeEmptyTable(unaff_retaddr,(u64)capacity);
  return;
}

Assistant:

HighsHashTable() { makeEmptyTable(128); }